

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOLinker::GetFileDependencies
          (cmBinUtilsMacOSMachOLinker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths)

{
  cmRuntimeDependencyArchive *pcVar1;
  bool bVar2;
  FileInfo *libs;
  string *name;
  string_view str;
  string_view str_00;
  bool unique;
  bool resolved;
  string path;
  string filename;
  bool local_aa;
  bool local_a9;
  string *local_a8;
  string *local_a0;
  string local_98;
  string *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  name = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = executablePath;
  local_78 = loaderPath;
  local_70 = rpaths;
  do {
    if (name == local_a0) {
LAB_003f82c7:
      return name == local_a0;
    }
    bVar2 = cmRuntimeDependencyArchive::IsPreExcluded((this->super_cmBinUtilsLinker).Archive,name);
    if (!bVar2) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      bVar2 = ResolveDependency(this,name,local_a8,local_78,local_70,&local_98,&local_a9);
      if (!bVar2) {
LAB_003f82bd:
        std::__cxx11::string::~string((string *)&local_98);
        goto LAB_003f82c7;
      }
      pcVar1 = (this->super_cmBinUtilsLinker).Archive;
      if (local_a9 == true) {
        bVar2 = cmRuntimeDependencyArchive::IsPostExcluded(pcVar1,&local_98);
        if (!bVar2) {
          str._M_str = local_98._M_dataplus._M_p;
          str._M_len = local_98._M_string_length;
          bVar2 = cmHasLiteralPrefix<17ul>(str,(char (*) [17])"/System/Library/");
          if (bVar2) {
LAB_003f81f9:
            bVar2 = cmsys::SystemTools::PathExists(&local_98);
            if (!bVar2) goto LAB_003f82a2;
          }
          else {
            str_00._M_str = local_98._M_dataplus._M_p;
            str_00._M_len = local_98._M_string_length;
            bVar2 = cmHasLiteralPrefix<10ul>(str_00,(char (*) [10])"/usr/lib/");
            if (bVar2) goto LAB_003f81f9;
          }
          cmsys::SystemTools::GetFilenameName(&local_68,&local_98);
          libs = GetFileInfo(this,&local_98);
          if (libs == (FileInfo *)0x0) {
LAB_003f82b3:
            std::__cxx11::string::~string((string *)&local_68);
            goto LAB_003f82bd;
          }
          pcVar1 = (this->super_cmBinUtilsLinker).Archive;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&libs->rpaths);
          cmRuntimeDependencyArchive::AddResolvedPath
                    (pcVar1,&local_68,&local_98,&local_aa,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if (local_aa == true) {
            bVar2 = ScanDependencies(this,&local_98,&libs->libs,&libs->rpaths,local_a8);
            if (!bVar2) goto LAB_003f82b3;
          }
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      else {
        cmRuntimeDependencyArchive::AddUnresolvedPath(pcVar1,name);
      }
LAB_003f82a2:
      std::__cxx11::string::~string((string *)&local_98);
    }
    name = name + 1;
  } while( true );
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::GetFileDependencies(
  std::vector<std::string> const& names, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths)
{
  for (std::string const& name : names) {
    if (!this->Archive->IsPreExcluded(name)) {
      std::string path;
      bool resolved;
      if (!this->ResolveDependency(name, executablePath, loaderPath, rpaths,
                                   path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path) &&
            !IsMissingSystemDylib(path)) {
          auto filename = cmSystemTools::GetFilenameName(path);
          bool unique;
          const FileInfo* dep_file_info = this->GetFileInfo(path);
          if (dep_file_info == nullptr) {
            return false;
          }

          this->Archive->AddResolvedPath(filename, path, unique,
                                         dep_file_info->rpaths);
          if (unique &&
              !this->ScanDependencies(path, dep_file_info->libs,
                                      dep_file_info->rpaths, executablePath)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(name);
      }
    }
  }

  return true;
}